

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time.cc
# Opt level: O0

Breakdown * absl::lts_20250127::anon_unknown_8::InfinitePastBreakdown(void)

{
  long lVar1;
  Breakdown *in_RDI;
  Duration DVar2;
  Breakdown *bd;
  HiRep local_50;
  uint32_t local_48;
  
  Time::Breakdown::Breakdown(in_RDI);
  lVar1 = std::numeric_limits<long>::min();
  in_RDI->year = lVar1;
  in_RDI->month = 1;
  in_RDI->day = 1;
  in_RDI->hour = 0;
  in_RDI->minute = 0;
  in_RDI->second = 0;
  DVar2 = InfiniteDuration();
  DVar2 = lts_20250127::operator-(DVar2);
  local_50 = DVar2.rep_hi_;
  local_48 = DVar2.rep_lo_;
  (in_RDI->subsecond).rep_hi_ = local_50;
  (in_RDI->subsecond).rep_lo_ = local_48;
  in_RDI->weekday = 7;
  in_RDI->yearday = 1;
  in_RDI->offset = 0;
  in_RDI->is_dst = false;
  in_RDI->zone_abbr = "-00";
  return in_RDI;
}

Assistant:

inline absl::Time::Breakdown InfinitePastBreakdown() {
  Time::Breakdown bd;
  bd.year = std::numeric_limits<int64_t>::min();
  bd.month = 1;
  bd.day = 1;
  bd.hour = 0;
  bd.minute = 0;
  bd.second = 0;
  bd.subsecond = -absl::InfiniteDuration();
  bd.weekday = 7;
  bd.yearday = 1;
  bd.offset = 0;
  bd.is_dst = false;
  bd.zone_abbr = "-00";
  return bd;
}